

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * update_D_Sym(D_Sym *sym,D_Scope **pst,int sizeof_D_Sym)

{
  D_Scope *st;
  D_Sym *pDVar1;
  
  st = enter_D_Scope(*pst,*pst);
  *pst = st;
  pDVar1 = update_additional_D_Sym(st,sym,sizeof_D_Sym);
  return pDVar1;
}

Assistant:

D_Sym *update_D_Sym(D_Sym *sym, D_Scope **pst, int sizeof_D_Sym) {
  *pst = enter_D_Scope(*pst, *pst);
  return update_additional_D_Sym(*pst, sym, sizeof_D_Sym);
}